

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_function_impl.h
# Opt level: O0

any_function<void_(dlib::toggle_button_&),_void,_1UL> * __thiscall
dlib::any_function<void_(dlib::toggle_button_&),_void,_1UL>::operator=
          (any_function<void_(dlib::toggle_button_&),_void,_1UL> *this,
          any_function<void_(dlib::toggle_button_&),_void,_1UL> *item)

{
  any_function<void_(dlib::toggle_button_&),_void,_1UL> *in_RDI;
  any_function<void_(dlib::toggle_button_&),_void,_1UL> *item_00;
  any_function<void_(dlib::toggle_button_&),_void,_1UL> *in_stack_ffffffffffffffd8;
  any_function<void_(dlib::toggle_button_&),_void,_1UL> *in_stack_ffffffffffffffe0;
  any_function<void_(dlib::toggle_button_&),_void,_1UL> local_18 [3];
  
  item_00 = local_18;
  any_function(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  swap(in_RDI,item_00);
  ~any_function((any_function<void_(dlib::toggle_button_&),_void,_1UL> *)0x485c85);
  return in_RDI;
}

Assistant:

any_function& operator= (
    const any_function& item
)
{
    any_function(item).swap(*this);
    return *this;
}